

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void intgemm::CompareEps<float>(float *reference,float *actual,Index size,float epsilon)

{
  StringRef capturedExpression;
  MessageBuilder *builder;
  MessageBuilder *this;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  double dVar1;
  AssertionHandler catchAssertionHandler;
  float threshold;
  ScopedMessage scopedMessage1;
  Index i;
  undefined4 in_stack_fffffffffffffdc8;
  Flags in_stack_fffffffffffffdcc;
  ExprLhs<const_float_&> in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  OfType in_stack_fffffffffffffddc;
  ScopedMessage *in_stack_fffffffffffffde0;
  StringRef *in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  ScopedMessage *this_00;
  undefined1 local_178 [108];
  float local_10c;
  float local_108;
  float local_104;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_f0 [212];
  uint local_1c;
  float local_18;
  uint local_14;
  long local_10;
  long local_8;
  
  local_18 = in_XMM0_Da;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    local_f0._16_16_ =
         (undefined1  [16])
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffdd0.m_lhs,
                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    this_00 = (ScopedMessage *)local_f0;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h",0x28);
    Catch::MessageBuilder::MessageBuilder
              ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,(SourceLineInfo *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffddc);
    Catch::MessageBuilder::operator<<
              ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
               (char (*) [15])CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    builder = Catch::MessageBuilder::operator<<
                        ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
                         (uint *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_fd = 0x20;
    Catch::MessageBuilder::operator<<
              ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    Catch::MessageBuilder::operator<<
              ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
               (float *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_fe = 0x20;
    Catch::MessageBuilder::operator<<
              ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    this = Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs,
                      (float *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    Catch::ScopedMessage::ScopedMessage(this_00,builder);
    Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)in_stack_fffffffffffffdd0.m_lhs);
    local_108 = 0.01;
    in_stack_fffffffffffffdf0 = local_18;
    dVar1 = Catch::clara::std::fabs((double)(ulong)*(uint *)(local_8 + (ulong)local_1c * 4));
    in_stack_fffffffffffffdf4 = SUB84(dVar1,0);
    local_10c = in_stack_fffffffffffffdf4;
    in_stack_fffffffffffffde8 = (StringRef *)std::max<float>(&local_108,&local_10c);
    local_104 = in_stack_fffffffffffffdf0 * *(float *)&in_stack_fffffffffffffde8->m_start;
    local_178._16_16_ =
         (undefined1  [16])
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffdd0.m_lhs,
                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    in_stack_fffffffffffffde0 = (ScopedMessage *)local_178;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffde0,
               "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h",0x2b);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffde0,
               (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    capturedExpression.m_size._0_4_ = in_stack_fffffffffffffdf0;
    capturedExpression.m_start = (char *)in_stack_fffffffffffffde8;
    capturedExpression.m_size._4_4_ = in_stack_fffffffffffffdf4;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffffde0,
               (StringRef *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               (SourceLineInfo *)in_stack_fffffffffffffdd0.m_lhs,capturedExpression,
               in_stack_fffffffffffffdcc);
    dVar1 = Catch::clara::std::fabs
                      ((double)(ulong)(uint)(*(float *)(local_8 + (ulong)local_1c * 4) -
                                            *(float *)(local_10 + (ulong)local_1c * 4)));
    in_stack_fffffffffffffddc = SUB84(dVar1,0);
    in_stack_fffffffffffffdd0 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                    (float *)0x1f1015);
    Catch::ExprLhs<float_const&>::operator<
              ((ExprLhs<const_float_&> *)this,
               (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)in_stack_fffffffffffffdd0.m_lhs,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
              );
    Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
              ((BinaryExpr<const_float_&,_const_float_&> *)0x1f1066);
    Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffdd0.m_lhs);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffdd0.m_lhs);
    Catch::ScopedMessage::~ScopedMessage(in_stack_fffffffffffffde0);
  }
  return;
}

Assistant:

void CompareEps(const Type* reference, const Type* actual, Index size, Type epsilon) {
  for (Index i = 0; i < size; ++i) {
    INFO("Inaccurate at " << i << ' ' << reference[i] << ' ' << actual[i]);
    // Ratio to maximum value.
    float threshold = epsilon * std::max<float>(0.01f, std::fabs(reference[i]));
    CHECK(std::fabs(reference[i] - actual[i]) < threshold);
  }
}